

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

void __thiscall cppcms::xss::rules::rules(rules *this,rules *other)

{
  data *v;
  copy_ptr<cppcms::xss::rules::data> *in_RSI;
  copy_ptr<cppcms::xss::rules::data> *in_RDI;
  data *in_stack_ffffffffffffffe0;
  
  v = (data *)operator_new(0xf8);
  data::data(in_stack_ffffffffffffffe0);
  booster::copy_ptr<cppcms::xss::rules::data>::copy_ptr(in_RDI,v);
  booster::copy_ptr<cppcms::xss::rules::data>::swap(in_RDI,in_RSI);
  return;
}

Assistant:

rules::rules(rules &&other) : d(new data())
	{
		d.swap(other.d);
	}